

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedBools::_InternalSerialize
          (TensorValue_RepeatedBools *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint size;
  void *pvVar1;
  ulong uVar2;
  bool bVar3;
  LogMessage *other;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  size_t sVar7;
  byte *ptr;
  undefined8 *puVar8;
  LogFinisher local_69;
  LogMessage local_68;
  
  if (0 < (this->values_).current_size_) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    size = (this->values_).current_size_;
    if (stream->end_ <= target) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_69,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    sVar7 = (size_t)(int)size;
    *target = 10;
    pbVar4 = target + 1;
    uVar6 = size;
    uVar5 = size;
    if (0x7f < size) {
      do {
        target = pbVar4;
        *target = (byte)uVar5 | 0x80;
        uVar6 = uVar5 >> 7;
        pbVar4 = target + 1;
        bVar3 = 0x3fff < uVar5;
        uVar5 = uVar6;
      } while (bVar3);
    }
    ptr = target + 2;
    *pbVar4 = (byte)uVar6;
    pvVar1 = (this->values_).arena_or_elements_;
    if ((long)stream->end_ - (long)ptr < (long)sVar7) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,pvVar1,size,ptr);
    }
    else {
      memcpy(ptr,pvVar1,sVar7);
      target = ptr + sVar7;
    }
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    pvVar1 = *(void **)((uVar2 & 0xfffffffffffffffc) + 8);
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar2 & 1) == 0) {
      puVar8 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar8 = (undefined8 *)((uVar2 & 0xfffffffffffffffc) + 8);
    }
    sVar7 = (size_t)(int)puVar8[1];
    if ((long)stream->end_ - (long)target < (long)sVar7) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,pvVar1,(int)puVar8[1],target);
    }
    else {
      memcpy(target,pvVar1,sVar7);
      target = target + sVar7;
    }
  }
  return target;
}

Assistant:

uint8_t* TensorValue_RepeatedBools::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.MILSpec.TensorValue.RepeatedBools)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated bool values = 1 [packed = true];
  if (this->_internal_values_size() > 0) {
    target = stream->WriteFixedPacked(1, _internal_values(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.MILSpec.TensorValue.RepeatedBools)
  return target;
}